

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O3

bool __thiscall
ON_AerialPhotoImage::SetImageSize
          (ON_AerialPhotoImage *this,int image_width_pixels,int image_height_pixels)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = iVar2;
  if (0 < image_height_pixels && 0 < image_width_pixels) {
    iVar2 = image_height_pixels;
    iVar1 = image_width_pixels;
  }
  this->m_image_width_pixels = iVar1;
  this->m_image_height_pixels = iVar2;
  return 0 < image_height_pixels && 0 < image_width_pixels;
}

Assistant:

bool ON_AerialPhotoImage::SetImageSize(
  int image_width_pixels,
  int image_height_pixels
  )
{
  bool rc = false;
  if ( image_width_pixels > 0 && image_height_pixels > 0 )
  {
    m_image_width_pixels = image_width_pixels;
    m_image_height_pixels = image_height_pixels;
    rc = true;
  }
  else
    UnsetImageSize();

  return rc;
}